

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O0

size_t __thiscall
google::protobuf::GeneratedCodeInfo_Annotation::ByteSizeLong(GeneratedCodeInfo_Annotation *this)

{
  uint uVar1;
  int iVar2;
  size_t sVar3;
  GeneratedCodeInfo_Annotation *in_RDI;
  int cached_size;
  int cached_size_1;
  size_t data_size;
  uint32 cached_has_bits;
  size_t total_size;
  memory_order __b;
  int in_stack_ffffffffffffff7c;
  RepeatedField<int> *in_stack_ffffffffffffff80;
  GeneratedCodeInfo_Annotation *this_00;
  undefined4 in_stack_ffffffffffffff88;
  undefined4 uVar4;
  size_t local_50;
  size_t local_40;
  
  local_50 = 0;
  sVar3 = internal::WireFormatLite::Int32Size(in_stack_ffffffffffffff80);
  if (sVar3 != 0) {
    local_50 = internal::WireFormatLite::Int32Size(0);
    local_50 = local_50 + 1;
  }
  iVar2 = internal::ToCachedSize(sVar3);
  this_00 = (GeneratedCodeInfo_Annotation *)&in_RDI->_path_cached_byte_size_;
  std::operator&(memory_order_relaxed,__memory_order_mask);
  uVar4 = 0;
  *(int *)&(this_00->super_Message).super_MessageLite._vptr_MessageLite = iVar2;
  local_50 = sVar3 + local_50;
  uVar1 = (in_RDI->_has_bits_).has_bits_[0];
  if ((uVar1 & 7) != 0) {
    if ((uVar1 & 1) != 0) {
      _internal_source_file_abi_cxx11_((GeneratedCodeInfo_Annotation *)0x5313f2);
      sVar3 = internal::WireFormatLite::StringSize((string *)0x5313fa);
      local_50 = sVar3 + 1 + local_50;
    }
    if ((uVar1 & 2) != 0) {
      _internal_begin(in_RDI);
      sVar3 = internal::WireFormatLite::Int32Size(0);
      local_50 = sVar3 + 1 + local_50;
    }
    if ((uVar1 & 4) != 0) {
      _internal_end(in_RDI);
      sVar3 = internal::WireFormatLite::Int32Size(0);
      local_50 = sVar3 + 1 + local_50;
    }
  }
  if (((uint)(in_RDI->_internal_metadata_).
             super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
             .ptr_ & 1) == 1) {
    local_40 = internal::ComputeUnknownFieldsSize
                         ((InternalMetadataWithArena *)in_RDI,
                          CONCAT44(uVar4,in_stack_ffffffffffffff88),(CachedSize *)this_00);
  }
  else {
    internal::ToCachedSize(local_50);
    SetCachedSize(this_00,in_stack_ffffffffffffff7c);
    local_40 = local_50;
  }
  return local_40;
}

Assistant:

size_t GeneratedCodeInfo_Annotation::ByteSizeLong() const {
// @@protoc_insertion_point(message_byte_size_start:google.protobuf.GeneratedCodeInfo.Annotation)
  size_t total_size = 0;

  ::PROTOBUF_NAMESPACE_ID::uint32 cached_has_bits = 0;
  // Prevent compiler warnings about cached_has_bits being unused
  (void) cached_has_bits;

  // repeated int32 path = 1 [packed = true];
  {
    size_t data_size = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::
      Int32Size(this->path_);
    if (data_size > 0) {
      total_size += 1 +
        ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::Int32Size(
            static_cast<::PROTOBUF_NAMESPACE_ID::int32>(data_size));
    }
    int cached_size = ::PROTOBUF_NAMESPACE_ID::internal::ToCachedSize(data_size);
    _path_cached_byte_size_.store(cached_size,
                                    std::memory_order_relaxed);
    total_size += data_size;
  }

  cached_has_bits = _has_bits_[0];
  if (cached_has_bits & 0x00000007u) {
    // optional string source_file = 2;
    if (cached_has_bits & 0x00000001u) {
      total_size += 1 +
        ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::StringSize(
          this->_internal_source_file());
    }

    // optional int32 begin = 3;
    if (cached_has_bits & 0x00000002u) {
      total_size += 1 +
        ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::Int32Size(
          this->_internal_begin());
    }

    // optional int32 end = 4;
    if (cached_has_bits & 0x00000004u) {
      total_size += 1 +
        ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::Int32Size(
          this->_internal_end());
    }

  }
  if (PROTOBUF_PREDICT_FALSE(_internal_metadata_.have_unknown_fields())) {
    return ::PROTOBUF_NAMESPACE_ID::internal::ComputeUnknownFieldsSize(
        _internal_metadata_, total_size, &_cached_size_);
  }
  int cached_size = ::PROTOBUF_NAMESPACE_ID::internal::ToCachedSize(total_size);
  SetCachedSize(cached_size);
  return total_size;
}